

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

st__table * Extra_bddNodePathsUnderCut(DdManager *dd,DdNode *bFunc,int CutLevel)

{
  int iVar1;
  st__table *table;
  st__table *Visited;
  st__table *CutNodes;
  st__generator *psVar2;
  DdNode *pDVar3;
  traventry *p;
  DdNode *aNode;
  char *local_50;
  DdNode *local_48;
  st__table *local_40;
  DdNode *local_38;
  
  s_CutLevel = CutLevel;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
    pDVar3 = dd->one;
    if (pDVar3 == bFunc) {
      st__insert(table,(char *)pDVar3,(char *)pDVar3);
      Cudd_Ref(dd->one);
      pDVar3 = dd->one;
    }
    else {
      st__insert(table,(char *)((ulong)pDVar3 ^ 1),(char *)((ulong)pDVar3 ^ 1));
      Cudd_Ref((DdNode *)((ulong)dd->one ^ 1));
      pDVar3 = (DdNode *)((ulong)dd->one ^ 1);
    }
    Cudd_Ref(pDVar3);
  }
  else {
    pDVar3 = Cudd_BddToAdd(dd,bFunc);
    Cudd_Ref(pDVar3);
    Visited = st__init_table(st__ptrcmp,st__ptrhash);
    CutNodes = st__init_table(st__ptrcmp,st__ptrhash);
    CountNodeVisits_rec(dd,pDVar3,Visited);
    local_40 = CutNodes;
    local_38 = pDVar3;
    CollectNodesAndComputePaths_rec(dd,pDVar3,dd->one,Visited,CutNodes);
    psVar2 = st__init_gen(Visited);
    iVar1 = st__gen(psVar2,(char **)&local_48,&local_50);
    if (iVar1 != 0) {
      do {
        Cudd_RecursiveDeref(dd,*(DdNode **)(local_50 + 8));
        if (local_50 != (char *)0x0) {
          free(local_50);
          local_50 = (char *)0x0;
        }
        iVar1 = st__gen(psVar2,(char **)&local_48,&local_50);
      } while (iVar1 != 0);
    }
    st__free_gen(psVar2);
    st__free_table(Visited);
    psVar2 = st__init_gen(local_40);
    iVar1 = st__gen(psVar2,(char **)&local_48,&local_50);
    if (iVar1 != 0) {
      do {
        pDVar3 = Cudd_addBddPattern(dd,local_48);
        Cudd_Ref(pDVar3);
        st__insert(table,(char *)pDVar3,local_50);
        iVar1 = st__gen(psVar2,(char **)&local_48,&local_50);
      } while (iVar1 != 0);
    }
    st__free_gen(psVar2);
    st__free_table(local_40);
    Cudd_RecursiveDeref(dd,local_38);
  }
  return table;
}

Assistant:

st__table * Extra_bddNodePathsUnderCut( DdManager * dd, DdNode * bFunc, int CutLevel )
{
    st__table * Visited;  // temporary table to remember the visited nodes
    st__table * CutNodes; // the result goes here
    st__table * Result; // the result goes here
    DdNode * aFunc;

    s_CutLevel = CutLevel;

    Result  = st__init_table( st__ptrcmp, st__ptrhash);;
    // the terminal cases
    if ( Cudd_IsConstant( bFunc ) )
    {
        if ( bFunc == b1 )
        {
            st__insert( Result, (char*)b1, (char*)b1 );
            Cudd_Ref( b1 );
            Cudd_Ref( b1 );
        }
        else
        {
            st__insert( Result, (char*)b0, (char*)b0 );
            Cudd_Ref( b0 );
            Cudd_Ref( b0 );
        }
        return Result;
    }

    // create the ADD to simplify processing (no complemented edges)
    aFunc = Cudd_BddToAdd( dd, bFunc );   Cudd_Ref( aFunc );

    // Step 1: Start the tables and collect information about the nodes above the cut 
    // this information tells how many edges point to each node
    Visited  = st__init_table( st__ptrcmp, st__ptrhash);;
    CutNodes = st__init_table( st__ptrcmp, st__ptrhash);;

    CountNodeVisits_rec( dd, aFunc, Visited );

    // Step 2: Traverse the BDD using the visited table and compute the sum of paths
    CollectNodesAndComputePaths_rec( dd, aFunc, b1, Visited, CutNodes );

    // at this point the table of cut nodes is ready and the table of visited is useless
    {
        st__generator * gen;
        DdNode * aNode;
        traventry * p;
        st__foreach_item( Visited, gen, (const char**)&aNode, (char**)&p )
        {
            Cudd_RecursiveDeref( dd, p->bSum );
            ABC_FREE( p );
        }
        st__free_table( Visited );
    }

    // go through the table CutNodes and create the BDD and the path to be returned
    {
        st__generator * gen;
        DdNode * aNode, * bNode, * bSum;
        st__foreach_item( CutNodes, gen, (const char**)&aNode, (char**)&bSum)
        {
            // aNode is not referenced, because aFunc is holding it
            bNode = Cudd_addBddPattern( dd, aNode );  Cudd_Ref( bNode ); 
            st__insert( Result, (char*)bNode, (char*)bSum );
            // the new table takes both refs
        }
        st__free_table( CutNodes );
    }

    // dereference the ADD
    Cudd_RecursiveDeref( dd, aFunc );

    // return the table
    return Result;

}